

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::SquaredNorm::backward_impl
          (SquaredNorm *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  int in_R8D;
  real scale;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff58;
  Tensor *in_stack_ffffffffffffff78;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  *in_stack_ffffffffffffff80;
  StorageBaseType *in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  
  if (in_R8D == 0) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::vec(in_stack_ffffffffffffff78);
    Eigen::operator*(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    Tensor::vec(in_stack_ffffffffffffff78);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    noalias(in_stack_ffffffffffffff58);
    Eigen::
    NoAlias<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator+=(in_stack_ffffffffffffff80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)in_stack_ffffffffffffff78);
    return;
  }
  __assert_fail("i < 1",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                ,0x7fb,
                "virtual void cnn::SquaredNorm::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void SquaredNorm::backward_impl(const vector<const Tensor*>& xs,
                                 const Tensor& fx,
                                 const Tensor& dEdf,
                                 unsigned i,
                                 Tensor& dEdxi) const {
  assert(i < 1);
#if HAVE_CUDA
  throw std::runtime_error("SquaredNorm not yet implemented for CUDA");
#else
  real scale = dEdf.v[0] * 2;
  dEdxi.vec().noalias() += scale * xs[0]->vec();
#endif
}